

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.h
# Opt level: O1

void __thiscall bidirectional::Search::replaceIntermediateLabel(Search *this,Label *label)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 local_29;
  Label *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  local_28 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<labelling::Label,std::allocator<labelling::Label>,labelling::Label_const&>
            (a_Stack_20,&local_28,(allocator<labelling::Label> *)&local_29,label);
  peVar1 = (this->intermediate_label).
           super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (this->intermediate_label).
            super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->intermediate_label).super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = local_28;
  (this->intermediate_label).super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = a_Stack_20[0]._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_28 = peVar1;
    a_Stack_20[0]._M_pi = this_00;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void replaceIntermediateLabel(const labelling::Label& label) {
    auto label_ptr = std::make_shared<labelling::Label>(label);
    intermediate_label.swap(label_ptr);
  }